

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

void stb_readdir_free(char **files)

{
  long lVar1;
  long lVar2;
  char **f2;
  char **local_18;
  
  lVar2 = 0;
  local_18 = files;
  while( true ) {
    if (files == (char **)0x0) {
      lVar1 = 0;
    }
    else {
      lVar1 = (long)*(int *)(files + -2);
    }
    if (lVar1 <= lVar2) break;
    free(files[lVar2]);
    lVar2 = lVar2 + 1;
  }
  stb_arr_free_(&local_18);
  return;
}

Assistant:

void stb_readdir_free(char **files)
{
   char **f2 = files;
   int i;
   for (i=0; i < stb_arr_len(f2); ++i)
      free(f2[i]);
   stb_arr_free(f2);
}